

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
                   (string *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
                   unsigned_long params_3,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_4,
                   unsigned_long params_5)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  string *in_R8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_00000010;
  string *in_stack_00000018;
  unsigned_long in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  unsigned_long in_stack_00000040;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [56];
  undefined8 local_38;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *local_30;
  string *params_1_00;
  
  local_38 = 6;
  local_30 = in_R9;
  params_1_00 = in_RDI;
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0xc06401);
  ::std::__cxx11::string::string(local_70,in_RDX);
  ::std::__cxx11::string::string(local_a0,in_RCX);
  ::std::__cxx11::string::string(local_c0,in_R8);
  ::std::__cxx11::string::string(local_e0,(string *)in_stack_00000008);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,params_1_00,
             in_stack_00000030,in_stack_00000038,in_stack_00000040);
  ::std::__cxx11::string::~string(local_e0);
  ::std::__cxx11::string::~string(local_c0);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string(local_70);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(local_30);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}